

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.h
# Opt level: O3

void __thiscall
rapidjson::
GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::RemoveDotSegments(GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                    *this)

{
  long lVar1;
  char cVar2;
  Ch *pCVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  char *__s;
  ulong uVar8;
  
  __s = this->path_;
  sVar4 = strlen(__s);
  uVar8 = sVar4 & 0xffffffff;
  if (uVar8 == 0) {
    uVar7 = 0;
  }
  else {
    uVar6 = 0;
    uVar5 = 0;
    do {
      pCVar3 = this->path_;
      sVar4 = 0;
      do {
        cVar2 = (pCVar3 + uVar6)[sVar4];
        if (cVar2 == '/') break;
        lVar1 = uVar6 + sVar4;
        sVar4 = sVar4 + 1;
      } while (lVar1 + 1U < uVar8);
      if (sVar4 == 1) {
        uVar7 = uVar5;
        if (pCVar3[uVar6] != '.') goto LAB_0013ae42;
      }
      else if (((sVar4 == 2) && (pCVar3[uVar6] == '.')) && (pCVar3[uVar6 + 1] == '.')) {
        if (uVar5 == 0) {
LAB_0013ae7b:
          uVar7 = 0;
        }
        else {
          if (pCVar3[uVar5 - 1] != '/') {
            __assert_fail("newpos == 0 || path_[newpos - 1] == \'/\'",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/uri.h"
                          ,0x1ac,
                          "void rapidjson::GenericUri<rapidjson::GenericValue<rapidjson::UTF8<>>>::RemoveDotSegments() [ValueType = rapidjson::GenericValue<rapidjson::UTF8<>>, Allocator = rapidjson::CrtAllocator]"
                         );
          }
          uVar7 = 1;
          if (uVar5 != 1) {
            do {
              if (uVar5 == 1) goto LAB_0013ae7b;
              uVar7 = uVar5 - 1;
              lVar1 = uVar5 - 2;
              uVar5 = uVar7;
            } while (pCVar3[lVar1] != '/');
          }
        }
      }
      else {
LAB_0013ae42:
        if (uVar6 < uVar5) {
          __assert_fail("newpos <= pathpos",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/uri.h"
                        ,0x1bd,
                        "void rapidjson::GenericUri<rapidjson::GenericValue<rapidjson::UTF8<>>>::RemoveDotSegments() [ValueType = rapidjson::GenericValue<rapidjson::UTF8<>>, Allocator = rapidjson::CrtAllocator]"
                       );
        }
        memmove(pCVar3 + uVar5,pCVar3 + uVar6,sVar4);
        uVar7 = uVar5 + sVar4;
        if (cVar2 == '/') {
          this->path_[uVar7] = '/';
          uVar7 = uVar7 + 1;
        }
      }
      uVar6 = uVar6 + sVar4 + 1;
      uVar5 = uVar7;
    } while (uVar6 < uVar8);
    __s = this->path_;
  }
  __s[uVar7] = '\0';
  return;
}

Assistant:

void RemoveDotSegments() {
        std::size_t pathlen = GetPathStringLength();
        std::size_t pathpos = 0;  // Position in path_
        std::size_t newpos = 0;   // Position in new path_

        // Loop through each segment in original path_
        while (pathpos < pathlen) {
            // Get next segment, bounded by '/' or end
            size_t slashpos = 0;
            while ((pathpos + slashpos) < pathlen) {
                if (path_[pathpos + slashpos] == '/') break;
                slashpos++;
            }
            // Check for .. and . segments
            if (slashpos == 2 && path_[pathpos] == '.' && path_[pathpos + 1] == '.') {
                // Backup a .. segment in the new path_
                // We expect to find a previously added slash at the end or nothing
                RAPIDJSON_ASSERT(newpos == 0 || path_[newpos - 1] == '/');
                size_t lastslashpos = newpos;
                // Make sure we don't go beyond the start segment
                if (lastslashpos > 1) {
                    // Find the next to last slash and back up to it
                    lastslashpos--;
                    while (lastslashpos > 0) {
                        if (path_[lastslashpos - 1] == '/') break;
                        lastslashpos--;
                    }
                    // Set the new path_ position
                    newpos = lastslashpos;
                }
            } else if (slashpos == 1 && path_[pathpos] == '.') {
                // Discard . segment, leaves new path_ unchanged
            } else {
                // Move any other kind of segment to the new path_
                RAPIDJSON_ASSERT(newpos <= pathpos);
                std::memmove(&path_[newpos], &path_[pathpos], slashpos * sizeof(Ch));
                newpos += slashpos;
                // Add slash if not at end
                if ((pathpos + slashpos) < pathlen) {
                    path_[newpos] = '/';
                    newpos++;
                }
            }
            // Move to next segment
            pathpos += slashpos + 1;
        }
        path_[newpos] = '\0';
    }